

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

int __thiscall
QHttpNetworkConnectionPrivate::init(QHttpNetworkConnectionPrivate *this,EVP_PKEY_CTX *ctx)

{
  QHttpNetworkConnection *pQVar1;
  long in_FS_OFFSET;
  int i;
  QHttpNetworkConnection *q;
  QHttpNetworkConnection *in_stack_ffffffffffffffb8;
  QTimer *pQVar2;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffffc0;
  QObject *this_00;
  int local_24;
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(this);
  for (local_24 = 0; local_24 < this->channelCount; local_24 = local_24 + 1) {
    q_func(this);
    QHttpNetworkConnectionChannel::setConnection
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this->channels[local_24].ssl = (bool)(this->encrypt & 1);
  }
  pQVar2 = &this->delayedConnectionTimer;
  QTimer::setSingleShot(SUB81(pQVar2,0));
  this_00 = local_10;
  QObject::connect(this_00,(char *)pQVar2,(QObject *)"2timeout()",(char *)pQVar1,0x3d38dc);
  QMetaObject::Connection::~Connection((Connection *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::init()
{
    Q_Q(QHttpNetworkConnection);
    for (int i = 0; i < channelCount; i++) {
        channels[i].setConnection(this->q_func());
        channels[i].ssl = encrypt;
    }

    delayedConnectionTimer.setSingleShot(true);
    QObject::connect(&delayedConnectionTimer, SIGNAL(timeout()), q, SLOT(_q_connectDelayedChannel()));
}